

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O3

int AF_AActor_A_MeleeAttack
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  undefined4 extraout_var;
  PClass *pPVar3;
  undefined4 in_register_00000014;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  AActor *self;
  char *__assertion;
  bool bVar5;
  FSoundID local_14;
  PClass *pPVar2;
  undefined4 extraout_var_00;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  uVar4 = CONCAT44(in_register_00000014,numparam);
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_003c8847;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    self = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (self != (AActor *)0x0) {
        pPVar2 = (self->super_DThinker).super_DObject.Class;
        if (pPVar2 == (PClass *)0x0) {
          iVar1 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self);
          pPVar2 = (PClass *)CONCAT44(extraout_var,iVar1);
          (self->super_DThinker).super_DObject.Class = pPVar2;
          uVar4 = extraout_RDX;
        }
        bVar5 = pPVar2 == (PClass *)0x0;
        ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),!bVar5);
        uVar4 = CONCAT71((int7)((ulong)uVar4 >> 8),bVar5);
        defaultparam = (TArray<VMValue,_VMValue> *)
                       CONCAT71((int7)((ulong)defaultparam >> 8),pPVar2 == pPVar3 || bVar5);
        if (pPVar2 != pPVar3 && !bVar5) {
          do {
            pPVar2 = pPVar2->ParentClass;
            ret = (VMReturn *)CONCAT71((int7)((ulong)ret >> 8),pPVar2 != (PClass *)0x0);
            if (pPVar2 == pPVar3) break;
          } while (pPVar2 != (PClass *)0x0);
        }
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003c8847;
        }
        goto LAB_003c87ef;
      }
    }
    else if (self != (AActor *)0x0) goto LAB_003c8837;
    self = (AActor *)0x0;
LAB_003c87ef:
    pPVar3 = (self->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar1 = (**(self->super_DThinker).super_DObject._vptr_DObject)(self,defaultparam,uVar4,ret);
      pPVar3 = (PClass *)CONCAT44(extraout_var_00,iVar1);
      (self->super_DThinker).super_DObject.Class = pPVar3;
    }
    DoAttack(self,true,false,pPVar3[1].SpecialInits.Count,&local_14,(PClassActor *)0x0,0.0);
    return 0;
  }
LAB_003c8837:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_003c8847:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x3c2,
                "int AF_AActor_A_MeleeAttack(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_MeleeAttack)
{
	PARAM_SELF_PROLOGUE(AActor);
	int MeleeDamage = self->GetClass()->MeleeDamage;
	FSoundID MeleeSound = self->GetClass()->MeleeSound;
	DoAttack(self, true, false, MeleeDamage, MeleeSound, NULL, 0);
	return 0;
}